

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O0

rnndecaddrinfo * rnndec_decodeaddr(rnndeccontext *ctx,rnndomain *domain,uint64_t addr,int write)

{
  int in_ECX;
  uint64_t in_RDX;
  long in_RSI;
  rnndeccontext *in_RDI;
  rnndecaddrinfo *res;
  rnndecaddrinfo *local_8;
  
  local_8 = trymatch(in_RDI,*(rnndelem ***)(in_RSI + 0x60),*(int *)(in_RSI + 0x68),in_RDX,in_ECX,
                     *(int *)(in_RSI + 0xc),(uint64_t *)0x0,0);
  if (local_8 == (rnndecaddrinfo *)0x0) {
    local_8 = (rnndecaddrinfo *)calloc(0x18,1);
    asprintf(&local_8->name,"%s%#lx%s",in_RDI->colors->cerr,in_RDX,in_RDI->colors->cend);
  }
  return local_8;
}

Assistant:

struct rnndecaddrinfo *rnndec_decodeaddr(struct rnndeccontext *ctx, struct rnndomain *domain, uint64_t addr, int write) {
	struct rnndecaddrinfo *res = trymatch(ctx, domain->subelems, domain->subelemsnum, addr, write, domain->width, 0, 0);
	if (res)
		return res;
	res = calloc (sizeof *res, 1);
	asprintf (&res->name, "%s%#"PRIx64"%s", ctx->colors->cerr, addr, ctx->colors->cend);
	return res;
}